

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

ref<immutable::transient_rrb<char,_false,_5>_> __thiscall
immutable::transient_rrb_push<char,false,5>
          (immutable *this,ref<immutable::transient_rrb<char,_false,_5>_> *trrb,char element)

{
  uint32_t uVar1;
  char *pcVar2;
  byte bVar3;
  guid_type gVar4;
  transient_rrb<char,_false,_5> *ptVar5;
  leaf_node<char,_false> *plVar6;
  internal_node<char,_false> *piVar7;
  rrb_size_table<false> *prVar8;
  ref<immutable::rrb_details::internal_node<char,false>> *prVar9;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set_00;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> *node;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  rrb_size_table<false> *local_98;
  rrb_size_table<false> *table;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_root;
  ref<immutable::rrb_details::internal_node<char,_false>_> old_root;
  uint local_78;
  uint32_t prev_shift;
  uint32_t child_index;
  uint32_t shift;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  uint32_t pos;
  uint32_t nodes_visited;
  uint32_t nodes_to_mutate;
  uint32_t index;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_48;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_tail;
  char *loc;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  guid_type guid;
  char *loc_1;
  char element_local;
  ref<immutable::transient_rrb<char,_false,_5>_> *trrb_local;
  
  rrb_details::check_transience<char,false,5>(trrb);
  ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
  if (ptVar5->tail_len < 0x20) {
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&ptVar5->tail);
    pcVar2 = plVar6->child;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    pcVar2[ptVar5->tail_len] = element;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ptVar5->cnt = ptVar5->cnt + 1;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ptVar5->tail_len = ptVar5->tail_len + 1;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&ptVar5->tail);
    plVar6->len = plVar6->len + 1;
    ref<immutable::transient_rrb<char,_false,_5>_>::ref
              ((ref<immutable::transient_rrb<char,_false,_5>_> *)this,trrb);
  }
  else {
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ptVar5->cnt = ptVar5->cnt + 1;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    new_tail.ptr._4_4_ = ptVar5->guid;
    plVar6 = rrb_details::transient_leaf_node_create<char,false,5>();
    ref<immutable::rrb_details::leaf_node<char,_false>_>::ref
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc,plVar6);
    gVar4 = new_tail.ptr._4_4_;
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc);
    plVar6->guid = gVar4;
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc);
    old_tail.ptr = (leaf_node<char,_false> *)plVar6->child;
    *(char *)&(old_tail.ptr)->type = element;
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc);
    plVar6->len = 1;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ptVar5->tail_len = 1;
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(&local_48,&ptVar5->tail);
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
              (&ptVar5->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc);
    ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
    if ((ptVar5->root).ptr == (tree_node<char,_false> *)0x0) {
      ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
      ptVar5->shift = 0;
      ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
      ref<immutable::rrb_details::tree_node<char,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&ptVar5->root,&local_48);
      ref<immutable::transient_rrb<char,_false,_5>_>::ref
                ((ref<immutable::transient_rrb<char,_false,_5>_> *)this,trrb);
    }
    else {
      ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
      nodes_visited = ptVar5->cnt - 2;
      pos = 0;
      current.ptr._4_4_ = 0;
      current.ptr._0_4_ = 0;
      ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
      ref<immutable::rrb_details::internal_node<char,false>>::
      ref<immutable::rrb_details::tree_node<char,false>>
                ((ref<immutable::rrb_details::internal_node<char,false>> *)&child_index,
                 &ptVar5->root);
      ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
      for (prev_shift = ptVar5->shift; 5 < prev_shift; prev_shift = prev_shift - 5) {
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_index
                           );
        if ((piVar7->size_table).ptr == (rrb_size_table<false> *)0x0) {
          bVar3 = (byte)prev_shift;
          if (nodes_visited >> (bVar3 + 5 & 0x1f) != 0) {
            current.ptr._4_4_ = current.ptr._4_4_ + 1;
            goto LAB_001763d8;
          }
          local_78 = nodes_visited >> (bVar3 & 0x1f) & 0x1f;
          nodes_visited = (0x1f << (bVar3 & 0x1f) ^ 0xffffffffU) & nodes_visited;
        }
        else {
          piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &child_index);
          uVar1 = piVar7->len;
          local_78 = uVar1 - 1;
          if (local_78 != 0) {
            piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                               ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                &child_index);
            prVar8 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                               (&piVar7->size_table);
            nodes_visited = nodes_visited - prVar8->size[uVar1 - 2];
          }
        }
        current.ptr._4_4_ = current.ptr._4_4_ + 1;
        if (local_78 < 0x1f) {
          current.ptr._0_4_ = local_78;
          pos = current.ptr._4_4_;
        }
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_index
                           );
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_index,
                   piVar7->child + local_78);
        if (_child_index == (internal_node<char,_false> *)0x0) {
          pos = current.ptr._4_4_;
          current.ptr._0_4_ = local_78;
          goto LAB_001763d8;
        }
      }
      if (prev_shift != 0) {
        current.ptr._4_4_ = current.ptr._4_4_ + 1;
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_index
                           );
        if (piVar7->len < 0x20) {
          pos = current.ptr._4_4_;
          piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &child_index);
          current.ptr._0_4_ = piVar7->len;
        }
      }
LAB_001763d8:
      for (; 5 < prev_shift; prev_shift = prev_shift - 5) {
        current.ptr._4_4_ = current.ptr._4_4_ + 1;
      }
      if (pos == 0) {
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        ref<immutable::rrb_details::internal_node<char,false>>::
        ref<immutable::rrb_details::tree_node<char,false>>
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)&new_root,&ptVar5->root
                  );
        piVar7 = rrb_details::transient_internal_node_create<char,false,5>();
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table,piVar7);
        gVar4 = new_tail.ptr._4_4_;
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
        piVar7->guid = gVar4;
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
        piVar7->len = 2;
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar7->child,
                   &ptVar5->root);
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        ref<immutable::rrb_details::tree_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::tree_node<char,false>> *)&ptVar5->root,
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        uVar1 = ptVar5->shift;
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        ptVar5->shift = uVar1 + 5;
        piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_root);
        if ((piVar7->type != LEAF_NODE) &&
           (((new_root.ptr)->size_table).ptr != (rrb_size_table<false> *)0x0)) {
          local_98 = rrb_details::transient_size_table_create<5,false>();
          local_98->guid = new_tail.ptr._4_4_;
          ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
          uVar1 = ptVar5->cnt;
          plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_48);
          *local_98->size = ~plVar6->len + uVar1;
          ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
          local_98->size[1] = ptVar5->cnt - 1;
          ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set,local_98);
          piVar7 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
          ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                    (&piVar7->size_table,
                     (ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
          ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
        }
        ptVar5 = ref<immutable::transient_rrb<char,_false,_5>_>::operator->(trrb);
        prVar9 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,5>
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                            (*(long *)&(ptVar5->root).ptr[1]._ref_count + 8),current.ptr._4_4_,
                            new_tail.ptr._4_4_);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar9,&local_48);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&table);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&new_root);
      }
      else {
        to_set_00 = rrb_details::mutate_first_k<char,false,5>(trrb,pos);
        prVar9 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,5>
                           (to_set_00,current.ptr._4_4_ - pos,new_tail.ptr._4_4_);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar9,&local_48);
      }
      ref<immutable::transient_rrb<char,_false,_5>_>::ref
                ((ref<immutable::transient_rrb<char,_false,_5>_> *)this,trrb);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_index);
    }
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_48);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&loc);
  }
  return (ref<immutable::transient_rrb<char,_false,_5>_>)(transient_rrb<char,_false,_5> *)this;
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> transient_rrb_push(ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, T element)
    {
    using namespace rrb_details;
    check_transience(trrb);
    if (trrb->tail_len < bits<N>::rrb_branching)
      {
      T* loc = (T*)((char*)trrb->tail->child + trrb->tail_len * sizeof(T));
      loc = new(loc) T(std::move(element)); // placement new      

      //trrb->tail->child[trrb->tail_len] = std::move(element);
      trrb->cnt++;
      trrb->tail_len++;
      trrb->tail->len++;
      // ^ consider deferring incrementing this until insertion and/or persistentified.
      return trrb;
      }

    trrb->cnt++;
    guid_type guid = trrb->guid;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = transient_leaf_node_create<T, atomic_ref_counting, N>();
    new_tail->guid = guid;
    
    T* loc = (T*)((char*)new_tail->child);
    loc = new(loc) T(std::move(element)); // placement new   

    //new_tail->child[0] = std::move(element);
    new_tail->len = 1;
    trrb->tail_len = 1;

    ref<leaf_node<T, atomic_ref_counting>> old_tail = trrb->tail;
    trrb->tail = new_tail;

    if (trrb->root.ptr == nullptr)
      { // If it's  null, we can't just mutate it down.
      trrb->shift = 0;
      trrb->root = old_tail;
      return trrb;
      }
    // mutable count starts here

    // TODO: Can find last rightmost jump in constant time for pvec subvecs:
    // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

    uint32_t index = trrb->cnt - 2;

    uint32_t nodes_to_mutate = 0;
    uint32_t nodes_visited = 0;
    uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                      // mutable node (or the element, if we can mutate the leaf)
    ref<internal_node<T, atomic_ref_counting>> current = trrb->root;

    uint32_t shift = trrb->shift;

    // checking all non-leaf nodes (or if tail, all but the lowest two levels)
    while (shift > bits<N>::rrb_bits)
      {
      // calculate child index
      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        // some check here to ensure we're not overflowing the pvec subvec.
        // important to realise that this only needs to be done once in a better
        // impl, the same way the size_table check only has to be done until it's
        // false.
        const uint32_t prev_shift = shift + bits<N>::rrb_bits;
        if (index >> prev_shift > 0)
          {
          nodes_visited++; // this could possibly be done earlier in the code.
          goto mutable_count_end;
          }
        child_index = (index >> shift) & bits<N>::rrb_mask;
        // index filtering is not necessary when the check above is performed at
        // most once.
        index &= ~(bits<N>::rrb_mask << shift);
        }
      else
        {
        // no need for sized_pos here, luckily.
        child_index = current->len - 1;
        // Decrement index
        if (child_index != 0)
          {
          index -= current->size_table->size[child_index - 1];
          }
        }
      nodes_visited++;
      if (child_index < bits<N>::rrb_mask)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;
        }

      current = current->child[child_index];
      // This will only happen in a pvec subtree
      if (current.ptr == nullptr)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;

        // if next element we're looking at is null, we can mutate all above. Good
        // times.
        goto mutable_count_end;
        }
      shift -= bits<N>::rrb_bits;
      }
    // if we're here, we're at the leaf node (or lowest non-leaf), which is
    // `current`

    // no need to even use index here: We know it'll be placed at current->len,
    // if there's enough space. That check is easy.
    if (shift != 0)
      {
      nodes_visited++;
      if (current->len < bits<N>::rrb_branching)
        {
        nodes_to_mutate = nodes_visited;
        pos = current->len;
        }
      }

  mutable_count_end:
    // GURRHH, nodes_visited is not yet handled nicely. loop down to get
    // nodes_visited set straight.
    while (shift > bits<N>::rrb_bits)
      {
      nodes_visited++;
      shift -= bits<N>::rrb_bits;
      }

    // Increasing height of tree.
    if (nodes_to_mutate == 0)
      {
      ref<internal_node<T, atomic_ref_counting>> old_root = trrb->root;
      ref<internal_node<T, atomic_ref_counting>> new_root = transient_internal_node_create<T, atomic_ref_counting, N>();
      new_root->guid = guid;
      new_root->len = 2;
      new_root->child[0] = trrb->root;
      trrb->root = new_root;
      trrb->shift = trrb->shift + bits<N>::rrb_bits;

      // create size table if the original rrb root has a size table.
      if (old_root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)old_root.ptr)->size_table.ptr != nullptr)
        {
        rrb_size_table<atomic_ref_counting>* table = transient_size_table_create<N, atomic_ref_counting>();
        table->guid = guid;
        table->size[0] = trrb->cnt - (old_tail->len + 1);
        // If we insert the tail, the old size minus (new size minus one) the old
        // tail size will be the amount of elements in the left branch. If there
        // is no tail, the size is just the old rrb-tree.

        table->size[1] = trrb->cnt - 1;
        // If we insert the tail, the old size would include the tail.
        // Consequently, it has to be the old size. If we have no tail, we append
        // a single element to the old vector, therefore it has to be one more
        // than the original (which means it is zero)

        new_root->size_table = table;
        }

      // nodes visited == original rrb tree height. Nodes visited > 0.
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(&((internal_node<T, atomic_ref_counting> *)trrb->root.ptr)->child[1], nodes_visited, guid);
      *to_set = old_tail;
      }
    else
      {
      ref<internal_node<T, atomic_ref_counting>>* node = mutate_first_k(trrb, nodes_to_mutate);
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(node, nodes_visited - nodes_to_mutate, guid);
      *to_set = old_tail;
      }

    return trrb;
    }